

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitLocalSet(BinaryInstWriter *this,LocalSet *curr)

{
  uint uVar1;
  size_t sVar2;
  BufferWithRandomAccess *pBVar3;
  mapped_type *pmVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  key_type local_38;
  
  local_38 = (key_type)Function::getLocalType(this->func,curr->index);
  sVar2 = wasm::Type::size((Type *)&local_38);
  uVar1 = (int)sVar2 - 1;
  if (uVar1 != 0) {
    lVar7 = (ulong)uVar1 << 0x20;
    iVar5 = (int)sVar2 + -2;
    do {
      pBVar3 = BufferWithRandomAccess::operator<<(this->o,'!');
      local_38 = (key_type)((ulong)curr->index + lVar7);
      pmVar4 = std::__detail::
               _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_38);
      BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)(uint)*pmVar4);
      lVar7 = lVar7 + -0x100000000;
      bVar9 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar9);
  }
  bVar9 = LocalSet::isTee(curr);
  if (bVar9) {
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,'\"');
    local_38.second = 0;
    local_38.first = curr->index;
    pmVar4 = std::__detail::
             _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_38);
    BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)(uint)*pmVar4);
    if (1 < sVar2) {
      uVar6 = 1;
      uVar8 = 2;
      do {
        pBVar3 = BufferWithRandomAccess::operator<<(this->o,' ');
        local_38 = (key_type)(uVar6 << 0x20 | (ulong)curr->index);
        pmVar4 = std::__detail::
                 _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_38);
        BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)(uint)*pmVar4);
        bVar9 = uVar8 < sVar2;
        uVar6 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar9);
    }
  }
  else {
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,'!');
    local_38.second = 0;
    local_38.first = curr->index;
    pmVar4 = std::__detail::
             _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,&local_38);
    BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)(uint)*pmVar4);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitLocalSet(LocalSet* curr) {
  size_t numValues = func->getLocalType(curr->index).size();
  for (Index i = numValues - 1; i >= 1; --i) {
    o << int8_t(BinaryConsts::LocalSet)
      << U32LEB(mappedLocals[std::make_pair(curr->index, i)]);
  }
  if (!curr->isTee()) {
    o << int8_t(BinaryConsts::LocalSet)
      << U32LEB(mappedLocals[std::make_pair(curr->index, 0)]);
  } else {
    o << int8_t(BinaryConsts::LocalTee)
      << U32LEB(mappedLocals[std::make_pair(curr->index, 0)]);
    for (Index i = 1; i < numValues; ++i) {
      o << int8_t(BinaryConsts::LocalGet)
        << U32LEB(mappedLocals[std::make_pair(curr->index, i)]);
    }
  }
}